

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O2

int __thiscall stk::FileRead::open(FileRead *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  FILE *pFVar3;
  ostream *poVar4;
  undefined7 extraout_var;
  size_t sVar5;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  uint in_ECX;
  char *pcVar6;
  StkFormat in_R8;
  char *pcVar7;
  StkFloat in_XMM0_Qa;
  char header [12];
  
  close(this,(int)__file);
  pFVar3 = fopen(*(char **)__file,"rb");
  this->fd_ = (FILE *)pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileRead::open: could not open or find file (");
    poVar4 = std::operator<<(poVar4,(string *)__file);
    std::operator<<(poVar4,")!");
    Stk::handleError(&this->super_Stk,FILE_NOT_FOUND);
  }
  if ((char)__oflag != '\0') {
    bVar1 = getRawInfo(this,*(char **)__file,in_ECX,in_R8,in_XMM0_Qa);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
    goto LAB_0010b8b8;
  }
  sVar5 = fread(header,4,3,(FILE *)this->fd_);
  if (sVar5 != 3) goto LAB_0010b9b5;
  if ((header._0_4_ == 0x46464952) && (header._8_4_ == 0x45564157)) {
    bVar1 = getWavInfo(this,*(char **)__file);
    iVar2 = (int)CONCAT71(extraout_var_02,bVar1);
LAB_0010b8b8:
    if ((char)iVar2 == '\0') goto LAB_0010b8bc;
  }
  else {
    if (header._0_4_ == 0x646e732e) {
      bVar1 = getSndInfo(this,*(char **)__file);
      iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
      goto LAB_0010b8b8;
    }
    if ((header._0_4_ == 0x4d524f46) &&
       ((header._8_4_ == 0x46464941 || (header._8_4_ == 0x43464941)))) {
      bVar1 = getAifInfo(this,*(char **)__file);
      iVar2 = (int)CONCAT71(extraout_var_01,bVar1);
      goto LAB_0010b8b8;
    }
    iVar2 = fseek((FILE *)this->fd_,0x7e,0);
    if (iVar2 == -1) {
LAB_0010b9b5:
      pcVar7 = ")!";
      pcVar6 = "FileRead::open: error reading file (";
      goto LAB_0010b9d3;
    }
    sVar5 = fread(header,2,1,(FILE *)this->fd_);
    if (sVar5 != 1) goto LAB_0010b9b5;
    if ((header._0_2_ == 0x494d) || (header._0_2_ == 0x4d49)) {
      bVar1 = getMatInfo(this,*(char **)__file);
      iVar2 = (int)CONCAT71(extraout_var_03,bVar1);
      goto LAB_0010b8b8;
    }
    poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,"FileRead::open: file (");
    poVar4 = std::operator<<(poVar4,(string *)__file);
    std::operator<<(poVar4,") format unknown.");
    Stk::handleError(&this->super_Stk,FILE_UNKNOWN_FORMAT);
LAB_0010b8bc:
    Stk::handleError(&this->super_Stk,FILE_ERROR);
    iVar2 = extraout_EAX;
  }
  if (this->fileSize_ != 0) {
    return iVar2;
  }
  pcVar7 = ") data size is zero!";
  pcVar6 = "FileRead::open: file (";
LAB_0010b9d3:
  poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,pcVar6);
  poVar4 = std::operator<<(poVar4,(string *)__file);
  std::operator<<(poVar4,pcVar7);
  Stk::handleError(&this->super_Stk,FILE_ERROR);
  return extraout_EAX_00;
}

Assistant:

void FileRead :: open( std::string fileName, bool typeRaw, unsigned int nChannels,
                       StkFormat format, StkFloat rate )
{
  // If another file is open, close it.
  close();

  // Try to open the file.
  fd_ = fopen( fileName.c_str(), "rb" );
  if ( !fd_ ) {
    oStream_ << "FileRead::open: could not open or find file (" << fileName << ")!";
    handleError( StkError::FILE_NOT_FOUND );
  }

  // Attempt to determine file type from header (unless RAW).
  bool result = false;
  if ( typeRaw )
    result = getRawInfo( fileName.c_str(), nChannels, format, rate );
  else {
    char header[12];
    if ( fread( &header, 4, 3, fd_ ) != 3 ) goto error;
    if ( !strncmp( header, "RIFF", 4 ) &&
         !strncmp( &header[8], "WAVE", 4 ) )
      result = getWavInfo( fileName.c_str() );
    else if ( !strncmp( header, ".snd", 4 ) )
      result = getSndInfo( fileName.c_str() );
    else if ( !strncmp( header, "FORM", 4 ) &&
              ( !strncmp( &header[8], "AIFF", 4 ) || !strncmp(&header[8], "AIFC", 4) ) )
      result = getAifInfo( fileName.c_str() );
    else {
      if ( fseek( fd_, 126, SEEK_SET ) == -1 ) goto error;
      if ( fread( &header, 2, 1, fd_ ) != 1 ) goto error;
      if ( !strncmp( header, "MI", 2 ) ||
           !strncmp( header, "IM", 2 ) )
        result = getMatInfo( fileName.c_str() );
      else {
        oStream_ << "FileRead::open: file (" << fileName << ") format unknown.";
        handleError( StkError::FILE_UNKNOWN_FORMAT );
      }
    }
  }

  // If here, we had a file type candidate but something else went wrong.
  if ( result == false )
    handleError( StkError::FILE_ERROR );

  // Check for empty files.
  if ( fileSize_ == 0 ) {
    oStream_ << "FileRead::open: file (" << fileName << ") data size is zero!";
    handleError( StkError::FILE_ERROR );
  }

  return;

 error:
  oStream_ << "FileRead::open: error reading file (" << fileName << ")!";
  handleError( StkError::FILE_ERROR );
}